

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_columnref_expression.cpp
# Opt level: O2

bool __thiscall
duckdb::BoundColumnRefExpression::Equals(BoundColumnRefExpression *this,BaseExpression *other_p)

{
  bool bVar1;
  BoundColumnRefExpression *pBVar2;
  
  bVar1 = Expression::Equals(&this->super_Expression,other_p);
  if (bVar1) {
    pBVar2 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>(other_p);
    bVar1 = this->depth == pBVar2->depth &&
            ((this->binding).column_index == (pBVar2->binding).column_index &&
            (pBVar2->binding).table_index == (this->binding).table_index);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool BoundColumnRefExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundColumnRefExpression>();
	return other.binding == binding && other.depth == depth;
}